

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool __thiscall
MeCab::FeatureIndex::buildBigramFeature
          (FeatureIndex *this,LearnerPath *path,char *rfeature,char *lfeature)

{
  char *pcVar1;
  StringBuffer *this_00;
  byte bVar2;
  pointer piVar3;
  iterator iVar4;
  _func_int ***ppp_Var5;
  LearnerPath *pLVar6;
  char cVar7;
  size_t sVar8;
  char *pcVar9;
  FeatureIndex *pFVar10;
  ostream *poVar11;
  int *__dest;
  size_t sVar12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *__buf_01;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  char *pcVar13;
  FeatureIndex *pFVar14;
  char **ppcVar15;
  pointer ppcVar16;
  int __fd;
  char *pcVar17;
  FeatureIndex *pFVar18;
  char *pcVar19;
  ulong uVar20;
  FeatureIndex *pFVar21;
  char *pcVar22;
  FeatureIndex *pFVar23;
  size_t max;
  char *p;
  int id;
  char *local_90;
  int local_84;
  FeatureIndex *local_80;
  FeatureIndex *local_78;
  char **local_70;
  char **local_68;
  char *local_60;
  size_t local_58;
  LearnerPath *local_50;
  FeatureIndex *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = rfeature;
  local_38 = lfeature;
  local_80 = (FeatureIndex *)operator_new__(0x800);
  local_60 = (char *)operator_new__(0x800);
  local_70 = (char **)operator_new__(0x200);
  local_68 = (char **)operator_new__(0x200);
  pcVar19 = local_60;
  piVar3 = (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar3) {
    (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_78 = this;
  local_50 = path;
  strncpy(local_60,local_40,0x800);
  strncpy((char *)local_80,local_38,0x800);
  sVar8 = strlen(pcVar19);
  if ((long)sVar8 < 1) {
    local_58 = 0;
  }
  else {
    pcVar13 = pcVar19 + sVar8;
    uVar20 = 0x40;
    local_58 = 0;
    ppcVar15 = local_68;
    do {
      for (; (cVar7 = *pcVar19, cVar7 == '\t' || (cVar7 == ' ')); pcVar19 = pcVar19 + 1) {
      }
      if (cVar7 == '\"') {
        pcVar19 = pcVar19 + 1;
        pcVar22 = pcVar19;
        for (pcVar9 = pcVar19;
            (pcVar17 = pcVar9, pcVar9 < pcVar13 &&
            ((*pcVar9 != '\"' ||
             (pcVar17 = pcVar9 + 1, pcVar1 = pcVar9 + 1, pcVar9 = pcVar17, *pcVar1 == '\"'))));
            pcVar9 = pcVar9 + 1) {
          *pcVar22 = *pcVar9;
          pcVar22 = pcVar22 + 1;
        }
        local_90 = (char *)CONCAT71(local_90._1_7_,0x2c);
        pcVar9 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar17,pcVar13,&local_90);
      }
      else {
        local_90 = (char *)CONCAT71(local_90._1_7_,0x2c);
        pcVar9 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar19,pcVar13,&local_90);
        pcVar22 = pcVar9;
      }
      if (1 < uVar20) {
        *pcVar22 = '\0';
      }
      uVar20 = uVar20 - 1;
      *ppcVar15 = pcVar19;
      local_58 = local_58 + 1;
      if (uVar20 == 0) break;
      ppcVar15 = ppcVar15 + 1;
      pcVar19 = pcVar9 + 1;
    } while (pcVar19 < pcVar13);
  }
  pFVar21 = local_80;
  pFVar18 = local_80;
  sVar8 = strlen((char *)local_80);
  if ((long)sVar8 < 1) {
    max = 0;
    __buf = extraout_RDX;
  }
  else {
    pFVar14 = (FeatureIndex *)((long)&pFVar21->_vptr_FeatureIndex + sVar8);
    uVar20 = 0x40;
    max = 0;
    ppcVar15 = local_70;
    do {
      for (; (cVar7 = *(char *)&pFVar21->_vptr_FeatureIndex, cVar7 == '\t' || (cVar7 == ' '));
          pFVar21 = (FeatureIndex *)((long)&pFVar21->_vptr_FeatureIndex + 1)) {
      }
      if (cVar7 == '\"') {
        pFVar21 = (FeatureIndex *)((long)&pFVar21->_vptr_FeatureIndex + 1);
        pFVar23 = pFVar21;
        for (pFVar10 = pFVar21;
            (pFVar18 = pFVar10, pFVar10 < pFVar14 &&
            ((*(char *)&pFVar10->_vptr_FeatureIndex != '\"' ||
             (pFVar18 = (FeatureIndex *)((long)&pFVar10->_vptr_FeatureIndex + 1),
             ppp_Var5 = &pFVar10->_vptr_FeatureIndex, pFVar10 = pFVar18,
             *(char *)((long)ppp_Var5 + 1) == '\"'))));
            pFVar10 = (FeatureIndex *)((long)&pFVar10->_vptr_FeatureIndex + 1)) {
          *(undefined1 *)&pFVar23->_vptr_FeatureIndex = *(undefined1 *)&pFVar10->_vptr_FeatureIndex;
          pFVar23 = (FeatureIndex *)((long)&pFVar23->_vptr_FeatureIndex + 1);
        }
        local_90 = (char *)CONCAT71(local_90._1_7_,0x2c);
        pFVar10 = (FeatureIndex *)
                  std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pFVar18,pFVar14,&local_90);
        __buf = extraout_RDX_00;
      }
      else {
        local_90 = (char *)CONCAT71(local_90._1_7_,0x2c);
        pFVar18 = pFVar21;
        pFVar10 = (FeatureIndex *)
                  std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pFVar21,pFVar14,&local_90);
        __buf = extraout_RDX_01;
        pFVar23 = pFVar10;
      }
      if (1 < uVar20) {
        *(undefined1 *)&pFVar23->_vptr_FeatureIndex = 0;
      }
      uVar20 = uVar20 - 1;
      *ppcVar15 = (char *)pFVar21;
      max = max + 1;
      if (uVar20 == 0) break;
      ppcVar15 = ppcVar15 + 1;
      pFVar21 = (FeatureIndex *)((long)&pFVar10->_vptr_FeatureIndex + 1);
    } while (pFVar21 < pFVar14);
  }
  local_48 = (FeatureIndex *)&local_78->feature_;
  ppcVar16 = (local_78->bigram_templs_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar16 !=
      (local_78->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &local_78->os_;
    do {
      local_90 = *ppcVar16;
      (local_78->os_).size_ = 0;
LAB_0010b75a:
      pcVar19 = local_90;
      cVar7 = *local_90;
      if (cVar7 == '%') {
        pcVar13 = local_90 + 1;
        bVar2 = local_90[1];
        local_90 = pcVar13;
        if (bVar2 < 0x6c) {
          if (bVar2 == 0x4c) {
            sVar12 = local_58;
            pcVar19 = getIndex(pFVar18,&local_90,local_68,local_58);
            __buf = __buf_01;
            if (pcVar19 == (char *)0x0) goto LAB_0010b9d4;
            pFVar18 = (FeatureIndex *)this_00;
            StringBuffer::write(this_00,(int)pcVar19,__buf_01,sVar12);
            __buf = extraout_RDX_06;
          }
          else {
            if (bVar2 != 0x52) goto LAB_0010b849;
            sVar12 = max;
            pcVar19 = getIndex(pFVar18,&local_90,local_70,max);
            __buf = __buf_00;
            if (pcVar19 == (char *)0x0) goto LAB_0010b9d4;
            pFVar18 = (FeatureIndex *)this_00;
            StringBuffer::write(this_00,(int)pcVar19,__buf_00,sVar12);
            __buf = extraout_RDX_03;
          }
          if (pcVar19 == (char *)0x0) goto LAB_0010b9d4;
        }
        else {
          __fd = (int)local_38;
          if ((bVar2 == 0x6c) || (__fd = (int)local_40, bVar2 == 0x72)) {
            pFVar18 = (FeatureIndex *)this_00;
            StringBuffer::write(this_00,__fd,__buf,(size_t)pcVar19);
            __buf = extraout_RDX_04;
          }
          else {
LAB_0010b849:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                       ,0x73);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1a3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"false",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"unknown meta char: ",0x13);
            local_84 = CONCAT31(local_84._1_3_,*pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)&stack0xffffffffffffff7c,1);
            pFVar18 = (FeatureIndex *)&stack0xffffffffffffff7b;
            die::~die((die *)pFVar18);
            __buf = extraout_RDX_05;
          }
        }
        goto LAB_0010b77f;
      }
      if (cVar7 == '\\') {
        pcVar19 = local_90 + 1;
        bVar2 = local_90[1];
        pcVar13 = (char *)(ulong)bVar2;
        cVar7 = '\0';
        local_90 = pcVar19;
        if (bVar2 < 0x66) {
          if (bVar2 == 0x5c) {
            cVar7 = '\\';
          }
          else if (bVar2 == 0x61) {
            cVar7 = '\a';
          }
          else if (bVar2 == 0x62) {
            cVar7 = '\b';
          }
        }
        else {
          __buf = (void *)(ulong)(bVar2 - 0x6e);
          if (bVar2 - 0x6e < 9) {
            pcVar13 = (char *)((long)&switchD_0010b7b2::switchdataD_001305d4 +
                              (long)(int)(&switchD_0010b7b2::switchdataD_001305d4)[(long)__buf]);
            switch(__buf) {
            case (void *)0x0:
              cVar7 = '\n';
              break;
            case (void *)0x4:
              cVar7 = '\r';
              break;
            case (void *)0x5:
              cVar7 = ' ';
              break;
            case (void *)0x6:
              cVar7 = '\t';
              break;
            case (void *)0x8:
              cVar7 = '\v';
            }
          }
          else if (bVar2 == 0x66) {
            cVar7 = '\f';
          }
        }
switchD_0010b7b2_caseD_6f:
        pFVar18 = (FeatureIndex *)this_00;
        StringBuffer::write(this_00,(int)cVar7,__buf,(size_t)pcVar13);
        __buf = extraout_RDX_02;
LAB_0010b77f:
        local_90 = local_90 + 1;
        goto LAB_0010b75a;
      }
      pcVar13 = local_90;
      if (cVar7 != '\0') goto switchD_0010b7b2_caseD_6f;
      StringBuffer::write(this_00,0,__buf,(size_t)local_90);
      pFVar18 = local_78;
      local_84 = (*local_78->_vptr_FeatureIndex[6])();
      __buf = extraout_RDX_07;
      if (local_84 != -1) {
        iVar4._M_current =
             (local_78->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (local_78->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          pFVar18 = local_48;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_48,iVar4,&stack0xffffffffffffff7c);
          __buf = extraout_RDX_08;
        }
        else {
          *iVar4._M_current = local_84;
          (local_78->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
LAB_0010b9d4:
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 !=
             (local_78->bigram_templs_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pFVar18 = local_78;
  local_90 = (char *)CONCAT44(local_90._4_4_,0xffffffff);
  iVar4._M_current =
       (local_78->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (local_78->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_48,iVar4,(int *)&local_90);
  }
  else {
    *iVar4._M_current = -1;
    (local_78->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  pLVar6 = local_50;
  __dest = ChunkFreeList<int>::alloc
                     (&pFVar18->feature_freelist_,
                      (long)(pFVar18->feature_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pFVar18->feature_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  pLVar6->fvector = __dest;
  piVar3 = (pFVar18->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar8 = (long)(pFVar18->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  if (sVar8 != 0) {
    memmove(__dest,piVar3,sVar8);
  }
  piVar3 = (pFVar18->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pFVar18->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (pFVar18->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  operator_delete__(local_68);
  operator_delete__(local_70);
  operator_delete__(local_60);
  operator_delete__(local_80);
  return true;
}

Assistant:

bool FeatureIndex::buildBigramFeature(LearnerPath *path,
                                      const char *rfeature,
                                      const char *lfeature) {
  scoped_fixed_array<char, BUFSIZE> rbuf;
  scoped_fixed_array<char, BUFSIZE> lbuf;
  scoped_fixed_array<char *, POSSIZE> R;
  scoped_fixed_array<char *, POSSIZE> L;

  feature_.clear();
  std::strncpy(lbuf.get(),  rfeature, lbuf.size());
  std::strncpy(rbuf.get(),  lfeature, rbuf.size());

  const size_t lsize = tokenizeCSV(lbuf.get(), L.get(), L.size());
  const size_t rsize = tokenizeCSV(rbuf.get(), R.get(), R.size());

  for (std::vector<const char*>::const_iterator it = bigram_templs_.begin();
       it != bigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'L': {
              const char *r = getIndex(const_cast<char **>(&p), L.get(), lsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'R': {
              const char *r = getIndex(const_cast<char **>(&p), R.get(), rsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'l':  os_ << lfeature; break;  // use lfeature as it is
            case 'r':  os_ << rfeature; break;
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';

    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->fvector);

  return true;
}